

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_stats_striped_avx2_256_32.c
# Opt level: O2

void arr_store_si256(int *array,__m256i vH,int32_t t,int32_t seglen,int32_t d,int32_t dlen)

{
  ulong uVar1;
  long lVar2;
  char in_XMM0_Ba;
  char in_XMM0_Bb;
  char in_XMM0_Bc;
  char in_XMM0_Bd;
  char in_XMM0_Be;
  char in_XMM0_Bf;
  char in_XMM0_Bg;
  char in_XMM0_Bh;
  char in_YMM0_H;
  char in_register_00001211;
  char in_register_00001212;
  char in_register_00001213;
  char in_register_00001214;
  char in_register_00001215;
  char in_register_00001216;
  char in_register_00001217;
  
  uVar1 = (ulong)(uint)dlen;
  lVar2 = (long)d;
  array[uVar1 * (long)t + lVar2] = (int)in_XMM0_Ba;
  array[(long)(seglen + t) * uVar1 + lVar2] = (int)in_XMM0_Bb;
  array[(long)(t + seglen * 2) * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(seglen * 3 + t) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)(t + seglen * 4) * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(seglen * 5 + t) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(seglen * 6 + t) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  array[(long)(seglen * 7 + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(t + seglen * 8) * uVar1 + lVar2] = (int)in_XMM0_Ba;
  array[(long)(seglen * 9 + t) * uVar1 + lVar2] = (int)in_XMM0_Bb;
  array[(long)(seglen * 10 + t) * uVar1 + lVar2] = (int)in_XMM0_Bc;
  array[(long)(seglen * 0xb + t) * uVar1 + lVar2] = (int)in_XMM0_Bd;
  array[(long)(seglen * 0xc + t) * uVar1 + lVar2] = (int)in_XMM0_Be;
  array[(long)(seglen * 0xd + t) * uVar1 + lVar2] = (int)in_XMM0_Bf;
  array[(long)(seglen * 0xe + t) * uVar1 + lVar2] = (int)in_XMM0_Bg;
  array[(long)(seglen * 0xf + t) * uVar1 + lVar2] = (int)in_XMM0_Bh;
  array[(long)(seglen * 0x10 + t) * uVar1 + lVar2] = (int)in_YMM0_H;
  array[(long)(seglen * 0x11 + t) * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)(seglen * 0x12 + t) * uVar1 + lVar2] = (int)in_register_00001212;
  array[(long)(seglen * 0x13 + t) * uVar1 + lVar2] = (int)in_register_00001213;
  array[(long)(seglen * 0x14 + t) * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(seglen * 0x15 + t) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(seglen * 0x16 + t) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x17 + t) * uVar1 + lVar2] = (int)in_register_00001217;
  array[(long)(seglen * 0x18 + t) * uVar1 + lVar2] = (int)in_YMM0_H;
  array[(long)(seglen * 0x19 + t) * uVar1 + lVar2] = (int)in_register_00001211;
  array[(long)(seglen * 0x1a + t) * uVar1 + lVar2] = (int)in_register_00001212;
  array[(long)(seglen * 0x1b + t) * uVar1 + lVar2] = (int)in_register_00001213;
  array[(long)(seglen * 0x1c + t) * uVar1 + lVar2] = (int)in_register_00001214;
  array[(long)(seglen * 0x1d + t) * uVar1 + lVar2] = (int)in_register_00001215;
  array[(long)(seglen * 0x1e + t) * uVar1 + lVar2] = (int)in_register_00001216;
  array[(long)(seglen * 0x1f + t) * uVar1 + lVar2] = (int)in_register_00001217;
  return;
}

Assistant:

static inline void arr_store_si256(
        int *array,
        __m256i vH,
        int32_t t,
        int32_t seglen,
        int32_t d,
        int32_t dlen)
{
    array[1LL*(0*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 0);
    array[1LL*(1*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 1);
    array[1LL*(2*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 2);
    array[1LL*(3*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 3);
    array[1LL*(4*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 4);
    array[1LL*(5*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 5);
    array[1LL*(6*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 6);
    array[1LL*(7*seglen+t)*dlen + d] = (int32_t)_mm256_extract_epi32_rpl(vH, 7);
}